

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass
          (SupportVectorClassifier *this,int32_t value)

{
  int local_4;
  
  google::protobuf::RepeatedField<int>::Add(&this->numberofsupportvectorsperclass_,&local_4);
  return;
}

Assistant:

inline void SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass(int32_t value) {
  numberofsupportvectorsperclass_.Add(value);
}